

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O3

void __thiscall Sandbox::renderUI(Sandbox *this)

{
  _Rb_tree_header *p_Var1;
  UniformFunctionsMap *pUVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  bool bVar20;
  uint uVar21;
  long lVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  char *pcVar31;
  char *pcVar32;
  bool bVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  WindowStyle WVar37;
  iterator iVar38;
  _Rb_tree_node_base *p_Var39;
  mapped_type *pmVar40;
  vec2 *pvVar41;
  pointer ppPVar42;
  pointer pPVar43;
  ulong uVar44;
  Fbo *_fbo;
  pointer pFVar45;
  pointer ppFVar46;
  mat4 *pmVar47;
  Vbo *pVVar48;
  Vbo *this_00;
  Shader *pSVar49;
  Camera *pCVar50;
  long *plVar51;
  vec2 vVar52;
  size_type *psVar53;
  _Self __tmp;
  char *pcVar54;
  Tracker *this_01;
  char *pcVar55;
  Pyramid *this_02;
  char *__end;
  ulong uVar56;
  float fVar57;
  float _far;
  float _near;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float _x;
  double dVar65;
  float _width;
  float fVar66;
  mat<4,_4,_float,_(glm::qualifier)0> Result;
  float local_1d0;
  float local_1c8;
  string local_1a8;
  undefined8 local_188;
  undefined8 uStack_180;
  long *local_178 [2];
  long local_168 [2];
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_158;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_154;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 aStack_150;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aStack_14c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_148;
  pointer pvStack_138;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 local_130;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 local_12c;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aStack_128;
  undefined8 uStack_124;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 local_11c;
  Camera *local_a8;
  Tracker *local_a0;
  float local_94;
  UniformFunctionsMap *local_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  double local_70;
  undefined1 local_68 [16];
  double local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  
  this_01 = &(this->uniforms).tracker;
  if ((this->uniforms).tracker.m_running == true) {
    _local_158 = (vec2)&aStack_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"renderUI","");
    Tracker::begin(this_01,(string *)&local_158);
    if (_local_158 != (vec2)&aStack_148) {
      operator_delete((void *)_local_158,
                      CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                               aStack_148._M_allocated_capacity._0_4_) + 1);
    }
  }
  local_a0 = this_01;
  if ((this->m_showTextures == true) &&
     (iVar35 = (int)(this->uniforms).super_Scene.textures._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count, 0 < iVar35)) {
    glDisable();
    if ((this->uniforms).tracker.m_running == true) {
      _local_158 = (vec2)&aStack_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"renderUI:textures","");
      Tracker::begin(this_01,(string *)&local_158);
      if (_local_158 != (vec2)&aStack_148) {
        operator_delete((void *)_local_158,
                        CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                 aStack_148._M_allocated_capacity._0_4_) + 1);
      }
    }
    iVar34 = vera::getWindowWidth();
    local_a8._0_4_ = (float)iVar34;
    iVar34 = vera::getWindowHeight();
    local_1c8 = (float)iVar34;
    dVar65 = (double)(1.0 / (float)iVar35);
    if (0.25 <= dVar65) {
      dVar65 = 0.25;
    }
    local_a8 = (Camera *)
               CONCAT44(local_a8._4_4_,
                        local_a8._0_4_ * (float)(dVar65 * 0.5) * (local_1c8 / local_a8._0_4_));
    vera::textAngle(0.0,(Font *)0x0);
    vera::textAlign(ALIGN_TOP,(Font *)0x0);
    vera::textAlign(ALIGN_LEFT,(Font *)0x0);
    local_188 = (double)CONCAT44(local_188._4_4_,local_a8._0_4_ * 0.2);
    fVar57 = vera::getPixelDensity(false);
    vera::textSize((float)local_188 / fVar57,(Font *)0x0);
    p_Var39 = (this->uniforms).super_Scene.textures._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    p_Var1 = &(this->uniforms).super_Scene.textures._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var39 != p_Var1) {
      fVar64 = (float)(dVar65 * 0.5) * local_1c8;
      local_1c8 = local_1c8 - fVar64;
      auVar58._0_8_ = -(double)fVar64;
      auVar58._8_4_ = 0;
      auVar58._12_4_ = 0x80000000;
      fVar57 = local_a8._0_4_ * 0.5;
      uStack_80 = auVar58._8_8_;
      local_88 = auVar58._0_8_ + auVar58._0_8_;
      do {
        iVar35 = (**(code **)(**(long **)(p_Var39 + 2) + 0x60))();
        local_188._0_4_ = (float)iVar35;
        iVar35 = (**(code **)(**(long **)(p_Var39 + 2) + 0x68))();
        local_188 = (double)CONCAT44(local_188._4_4_,
                                     ((float)local_188 / (float)iVar35) * local_a8._0_4_);
        iVar38 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>_>
                 ::find(&(this->uniforms).super_Scene.streams._M_t,(key_type *)(p_Var39 + 1));
        if ((_Rb_tree_header *)iVar38._M_node ==
            &(this->uniforms).super_Scene.streams._M_t._M_impl.super__Rb_tree_header) {
          vera::image(*(Texture **)(p_Var39 + 2),(float)local_188 * 0.5 + fVar57,local_1c8,
                      (float)local_188,fVar64);
        }
        else {
          vera::image(*(TextureStream **)(iVar38._M_node + 2),(float)local_188 * 0.5 + fVar57,
                      local_1c8,(float)local_188,fVar64,true);
        }
        iVar35 = vera::getWindowHeight();
        vera::text((string *)(p_Var39 + 1),0.0,((float)iVar35 - local_1c8) - fVar64,(Font *)0x0);
        local_1c8 = (float)((double)local_1c8 + local_88);
        p_Var39 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var39);
      } while ((_Rb_tree_header *)p_Var39 != p_Var1);
    }
    this_01 = local_a0;
    if ((this->uniforms).tracker.m_running != false) {
      _local_158 = (vec2)&aStack_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"renderUI:textures","");
      Tracker::end(this_01,(string *)&local_158);
      if (_local_158 != (vec2)&aStack_148) {
        operator_delete((void *)_local_158,
                        CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                 aStack_148._M_allocated_capacity._0_4_) + 1);
      }
    }
  }
  if (this->m_showPasses == true) {
    glDisable(0xb71);
    if ((this->uniforms).tracker.m_running == true) {
      _local_158 = (vec2)&aStack_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"renderUI:buffers","");
      Tracker::begin(this_01,(string *)&local_158);
      if (_local_158 != (vec2)&aStack_148) {
        operator_delete((void *)_local_158,
                        CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                 aStack_148._M_allocated_capacity._0_4_) + 1);
      }
    }
    iVar35 = (int)((long)(this->uniforms).floods.
                         super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->uniforms).floods.
                         super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                         super__Vector_impl_data._M_start >> 6) * -0x55555555 +
             (int)((long)(this->uniforms).pyramids.
                         super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->uniforms).pyramids.
                         super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                         super__Vector_impl_data._M_start >> 7) * -0x45d1745d +
             (int)((long)(this->uniforms).doubleBuffers.
                         super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->uniforms).doubleBuffers.
                         super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3) +
             (int)((long)(this->uniforms).buffers.
                         super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->uniforms).buffers.
                         super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3);
    if ((this->uniforms).super_Scene.models._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      _local_158 = (vec2)&aStack_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"u_scene","");
      pUVar2 = &(this->uniforms).functions;
      pmVar40 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                ::operator[](pUVar2,(key_type *)&local_158);
      bVar33 = pmVar40->present;
      if (_local_158 != (vec2)&aStack_148) {
        operator_delete((void *)_local_158,
                        CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                 aStack_148._M_allocated_capacity._0_4_) + 1);
      }
      _local_158 = (vec2)&aStack_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"u_sceneDepth","");
      pmVar40 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                ::operator[](pUVar2,(key_type *)&local_158);
      bVar20 = pmVar40->present;
      if (_local_158 != (vec2)&aStack_148) {
        operator_delete((void *)_local_158,
                        CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                 aStack_148._M_allocated_capacity._0_4_) + 1);
      }
      iVar35 = (uint)bVar33 + iVar35 + 1 + (uint)bVar20;
    }
    _local_158 = (vec2)&aStack_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"u_sceneNormal","");
    pUVar2 = &(this->uniforms).functions;
    pmVar40 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
              ::operator[](pUVar2,(key_type *)&local_158);
    bVar33 = pmVar40->present;
    if (_local_158 != (vec2)&aStack_148) {
      operator_delete((void *)_local_158,
                      CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                               aStack_148._M_allocated_capacity._0_4_) + 1);
    }
    _local_158 = (vec2)&aStack_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"u_scenePosition","");
    pmVar40 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
              ::operator[](pUVar2,(key_type *)&local_158);
    bVar20 = pmVar40->present;
    if (_local_158 != (vec2)&aStack_148) {
      operator_delete((void *)_local_158,
                      CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                               aStack_148._M_allocated_capacity._0_4_) + 1);
    }
    iVar35 = (uint)bVar20 + iVar35 + (uint)bVar33 + (int)(this->m_sceneRender).m_buffers_total;
    if (0 < iVar35) {
      local_90 = pUVar2;
      iVar34 = vera::getWindowWidth();
      iVar36 = vera::getWindowHeight();
      dVar65 = (double)(1.0 / (float)iVar35);
      if (0.25 <= dVar65) {
        dVar65 = 0.25;
      }
      _width = (float)(dVar65 * 0.5) * (float)iVar34;
      fVar57 = (float)(dVar65 * 0.5) * (float)iVar36;
      _x = (float)iVar34 - _width;
      local_1d0 = (float)iVar36 - fVar57;
      vera::textAngle(0.0,(Font *)0x0);
      fVar64 = vera::getPixelDensity(false);
      vera::textSize((_width * 0.2) / fVar64,(Font *)0x0);
      vera::textAlign(ALIGN_TOP,(Font *)0x0);
      vera::textAlign(ALIGN_LEFT,(Font *)0x0);
      local_178[0] = (long *)0x0;
      ppFVar46 = (this->uniforms).buffers.
                 super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((this->uniforms).buffers.super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppFVar46) {
        auVar59._0_8_ = -(double)fVar57;
        auVar59._8_4_ = 0;
        auVar59._12_4_ = 0x80000000;
        uStack_180 = auVar59._8_8_;
        local_188 = auVar59._0_8_ + auVar59._0_8_;
        do {
          iVar35 = (*ppFVar46[(long)local_178[0]]->_vptr_Fbo[5])();
          iVar34 = (*(this->uniforms).buffers.
                     super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)local_178[0]]->_vptr_Fbo[6])();
          fVar64 = ((float)iVar35 / (float)iVar34) * fVar57;
          vera::image((this->uniforms).buffers.
                      super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)local_178[0]],(_width - fVar64) + _x,
                      local_1d0,fVar64,fVar57);
          vera::toString<unsigned_long>(&local_1a8,(unsigned_long *)local_178);
          pvVar41 = (vec2 *)std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,0x2e0629);
          vVar52 = (vec2)(pvVar41 + 2);
          if (*pvVar41 == vVar52) {
            aStack_148._8_8_ = pvVar41[3];
            aStack_148._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar52;
            aStack_148._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar52 >> 0x20);
            _local_158 = (vec2)&aStack_148;
          }
          else {
            aStack_148._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar52;
            aStack_148._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar52 >> 0x20);
            _local_158 = *pvVar41;
          }
          aStack_150 = pvVar41[1].field_0;
          aStack_14c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
                       pvVar41[1].field_1;
          *pvVar41 = vVar52;
          pvVar41[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
          pvVar41[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
          *(undefined1 *)&pvVar41[2].field_0 = 0;
          iVar35 = vera::getWindowHeight();
          vera::text((string *)&local_158,_x - fVar64,((float)iVar35 - local_1d0) - fVar57,
                     (Font *)0x0);
          if (_local_158 != (vec2)&aStack_148) {
            operator_delete((void *)_local_158,
                            CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                     aStack_148._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          local_1d0 = (float)((double)local_1d0 + local_188);
          local_178[0] = (long *)((long)local_178[0] + 1);
          ppFVar46 = (this->uniforms).buffers.
                     super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
        } while (local_178[0] <
                 (long *)((long)(this->uniforms).buffers.
                                super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)ppFVar46 >> 3));
      }
      local_178[0] = (long *)0x0;
      ppPVar42 = (this->uniforms).doubleBuffers.
                 super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((this->uniforms).doubleBuffers.
          super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppPVar42) {
        auVar60._0_8_ = -(double)fVar57;
        auVar60._8_4_ = 0;
        auVar60._12_4_ = 0x80000000;
        uStack_180 = auVar60._8_8_;
        local_188 = auVar60._0_8_ + auVar60._0_8_;
        do {
          iVar35 = (*ppPVar42[(long)local_178[0]]->src->_vptr_Fbo[5])();
          iVar34 = (*(this->uniforms).doubleBuffers.
                     super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl
                     .super__Vector_impl_data._M_start[(long)local_178[0]]->src->_vptr_Fbo[6])();
          fVar64 = ((float)iVar35 / (float)iVar34) * fVar57;
          vera::image((this->uniforms).doubleBuffers.
                      super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[(long)local_178[0]]->src,
                      (_width - fVar64) + _x,local_1d0,fVar64,fVar57);
          vera::toString<unsigned_long>(&local_1a8,(unsigned_long *)local_178);
          pvVar41 = (vec2 *)std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,0x2e0644);
          vVar52 = (vec2)(pvVar41 + 2);
          if (*pvVar41 == vVar52) {
            aStack_148._8_8_ = pvVar41[3];
            aStack_148._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar52;
            aStack_148._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar52 >> 0x20);
            _local_158 = (vec2)&aStack_148;
          }
          else {
            aStack_148._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar52;
            aStack_148._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar52 >> 0x20);
            _local_158 = *pvVar41;
          }
          aStack_150 = pvVar41[1].field_0;
          aStack_14c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
                       pvVar41[1].field_1;
          *pvVar41 = vVar52;
          pvVar41[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
          pvVar41[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
          *(undefined1 *)&pvVar41[2].field_0 = 0;
          iVar35 = vera::getWindowHeight();
          vera::text((string *)&local_158,_x - fVar64,((float)iVar35 - local_1d0) - fVar57,
                     (Font *)0x0);
          if (_local_158 != (vec2)&aStack_148) {
            operator_delete((void *)_local_158,
                            CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                     aStack_148._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          local_1d0 = (float)((double)local_1d0 + local_188);
          local_178[0] = (long *)((long)local_178[0] + 1);
          ppPVar42 = (this->uniforms).doubleBuffers.
                     super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl
                     .super__Vector_impl_data._M_start;
        } while (local_178[0] <
                 (long *)((long)(this->uniforms).doubleBuffers.
                                super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar42 >> 3));
      }
      local_178[0] = (long *)0x0;
      pPVar43 = (this->uniforms).pyramids.
                super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->uniforms).pyramids.
          super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
          super__Vector_impl_data._M_finish != pPVar43) {
        dVar65 = (double)fVar57;
        local_70 = (double)_x;
        local_78 = -dVar65 + -dVar65;
        local_58 = dVar65 * 0.5;
        uStack_50 = 0;
        local_68._8_4_ = 0;
        local_68._0_8_ = -dVar65 * 0.5;
        local_68._12_4_ = 0x80000000;
        do {
          iVar35 = (*pPVar43[(long)local_178[0]]._vptr_Pyramid[2])(pPVar43 + (long)local_178[0]);
          pPVar43 = (this->uniforms).pyramids.
                    super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar34 = (*pPVar43[(long)local_178[0]]._vptr_Pyramid[3])(pPVar43 + (long)local_178[0]);
          local_1c8 = ((float)iVar35 / (float)iVar34) * fVar57;
          pPVar43 = (this->uniforms).pyramids.
                    super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar21 = pPVar43[(long)local_178[0]].m_depth;
          uVar44 = (ulong)uVar21;
          if ((uVar21 & 0x7fffffff) != 0) {
            this_02 = pPVar43 + (long)local_178[0];
            fVar66 = (_width - local_1c8) + _x;
            local_48._8_4_ = (int)uStack_50;
            local_48._0_8_ = local_58 + (double)local_1d0;
            local_48._12_4_ = (int)((ulong)uStack_50 >> 0x20);
            local_88 = (double)local_1d0 + (double)local_68._0_8_;
            local_94 = local_1c8 + local_1c8;
            uVar56 = 0;
            local_188 = (double)CONCAT44(local_188._4_4_,fVar57);
            fVar64 = local_1d0;
            do {
              local_a8 = (Camera *)CONCAT44(local_a8._4_4_,fVar64);
              _fbo = vera::Pyramid::getResult(this_02,(uint)uVar56);
              fVar64 = fVar66;
              if (uVar44 <= uVar56) {
                fVar64 = local_94 + fVar66;
              }
              vera::image(_fbo,fVar64,local_a8._0_4_,local_1c8,(float)local_188);
              pPVar43 = (this->uniforms).pyramids.
                        super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar21 = pPVar43[(long)local_178[0]].m_depth;
              uVar44 = (ulong)uVar21;
              dVar65 = local_88;
              if (uVar56 >= uVar44) {
                dVar65 = (double)local_48._0_8_;
              }
              fVar66 = fVar66 - local_1c8;
              this_02 = pPVar43 + (long)local_178[0];
              local_1c8 = local_1c8 * *(float *)(&DAT_002dd508 + (ulong)(uVar56 < uVar44) * 4);
              local_188 = (double)CONCAT44(local_188._4_4_,
                                           (float)local_188 *
                                           *(float *)(&DAT_002dd508 + (ulong)(uVar56 < uVar44) * 4))
              ;
              fVar64 = (float)dVar65;
              fVar66 = fVar66 - local_1c8;
              uVar56 = uVar56 + 1;
            } while (uVar56 < uVar21 * 2);
          }
          vera::toString<unsigned_long>(&local_1a8,(unsigned_long *)local_178);
          pvVar41 = (vec2 *)std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,0x2defe7);
          vVar52 = (vec2)(pvVar41 + 2);
          if (*pvVar41 == vVar52) {
            aStack_148._8_8_ = pvVar41[3];
            aStack_148._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar52;
            aStack_148._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar52 >> 0x20);
            _local_158 = (vec2)&aStack_148;
          }
          else {
            aStack_148._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar52;
            aStack_148._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar52 >> 0x20);
            _local_158 = *pvVar41;
          }
          aStack_150 = pvVar41[1].field_0;
          aStack_14c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
                       pvVar41[1].field_1;
          *pvVar41 = vVar52;
          pvVar41[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
          pvVar41[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
          *(undefined1 *)&pvVar41[2].field_0 = 0;
          iVar35 = vera::getWindowHeight();
          vera::text((string *)&local_158,
                     (float)(local_70 - ((double)local_1c8 + (double)local_1c8)),
                     ((float)iVar35 - local_1d0) - fVar57,(Font *)0x0);
          if (_local_158 != (vec2)&aStack_148) {
            operator_delete((void *)_local_158,
                            CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                     aStack_148._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          local_1d0 = (float)((double)local_1d0 + local_78);
          local_178[0] = (long *)((long)local_178[0] + 1);
          pPVar43 = (this->uniforms).pyramids.
                    super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (local_178[0] <
                 (long *)(((long)(this->uniforms).pyramids.
                                 super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)pPVar43 >> 7) *
                         0x2e8ba2e8ba2e8ba3));
      }
      local_178[0] = (long *)0x0;
      pFVar45 = (this->uniforms).floods.
                super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->uniforms).floods.super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>.
          _M_impl.super__Vector_impl_data._M_finish != pFVar45) {
        auVar61._0_8_ = -(double)fVar57;
        auVar61._8_4_ = 0;
        auVar61._12_4_ = 0x80000000;
        uStack_180 = auVar61._8_8_;
        local_188 = auVar61._0_8_ + auVar61._0_8_;
        do {
          iVar35 = (*(pFVar45[(long)local_178[0]].super_PingPong.dst)->_vptr_Fbo[5])();
          iVar34 = (*((this->uniforms).floods.
                      super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)local_178[0]].super_PingPong.dst)->
                     _vptr_Fbo[6])();
          fVar64 = ((float)iVar35 / (float)iVar34) * fVar57;
          vera::image((this->uniforms).floods.
                      super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)local_178[0]].super_PingPong.dst,
                      (_width - fVar64) + _x,local_1d0,fVar64,fVar57);
          vera::toString<unsigned_long>(&local_1a8,(unsigned_long *)local_178);
          pvVar41 = (vec2 *)std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,0x2deec7);
          vVar52 = (vec2)(pvVar41 + 2);
          if (*pvVar41 == vVar52) {
            aStack_148._8_8_ = pvVar41[3];
            aStack_148._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar52;
            aStack_148._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar52 >> 0x20);
            _local_158 = (vec2)&aStack_148;
          }
          else {
            aStack_148._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar52;
            aStack_148._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar52 >> 0x20);
            _local_158 = *pvVar41;
          }
          aStack_150 = pvVar41[1].field_0;
          aStack_14c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
                       pvVar41[1].field_1;
          *pvVar41 = vVar52;
          pvVar41[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
          pvVar41[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
          *(undefined1 *)&pvVar41[2].field_0 = 0;
          iVar35 = vera::getWindowHeight();
          vera::text((string *)&local_158,_x - fVar64,((float)iVar35 - local_1d0) - fVar57,
                     (Font *)0x0);
          if (_local_158 != (vec2)&aStack_148) {
            operator_delete((void *)_local_158,
                            CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                     aStack_148._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          local_1d0 = (float)((double)local_1d0 + local_188);
          local_178[0] = (long *)((long)local_178[0] + 1);
          pFVar45 = (this->uniforms).floods.
                    super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (local_178[0] <
                 (long *)(((long)(this->uniforms).floods.
                                 super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)pFVar45 >> 6) *
                         -0x5555555555555555));
      }
      if ((this->uniforms).super_Scene.models._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
      {
        vera::fill(0.0);
        p_Var39 = (this->uniforms).super_Scene.lights._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        p_Var1 = &(this->uniforms).super_Scene.lights._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var39 != p_Var1) {
          auVar62._0_8_ = -(double)fVar57;
          auVar62._8_4_ = 0;
          auVar62._12_4_ = 0x80000000;
          uStack_180 = auVar62._8_8_;
          local_188 = auVar62._0_8_ + auVar62._0_8_;
          do {
            lVar22 = *(long *)(p_Var39 + 2);
            if ((*(char *)(lVar22 + 0x100) == '\x01') && (*(int *)(lVar22 + 0xec) != 0)) {
              vera::imageDepth((Fbo *)(lVar22 + 0xd0),_x,local_1d0,_width,fVar57,
                               *(float *)(lVar22 + 0x20c),*(float *)(lVar22 + 0x208));
              _local_158 = (vec2)&aStack_148;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_158,"u_lightShadowMap","");
              iVar35 = vera::getWindowHeight();
              vera::text((string *)&local_158,_x - _width,((float)iVar35 - local_1d0) - fVar57,
                         (Font *)0x0);
              if (_local_158 != (vec2)&aStack_148) {
                operator_delete((void *)_local_158,
                                CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                         aStack_148._M_allocated_capacity._0_4_) + 1);
              }
              local_1d0 = (float)((double)local_1d0 + local_188);
            }
            p_Var39 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var39);
          } while ((_Rb_tree_header *)p_Var39 != p_Var1);
        }
        vera::fill(1.0);
      }
      _local_158 = (vec2)&aStack_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"u_scenePosition","");
      pUVar2 = local_90;
      pmVar40 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                ::operator[](local_90,(key_type *)&local_158);
      bVar33 = pmVar40->present;
      if (_local_158 != (vec2)&aStack_148) {
        operator_delete((void *)_local_158,
                        CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                 aStack_148._M_allocated_capacity._0_4_) + 1);
      }
      if (bVar33 != false) {
        vera::image(&(this->m_sceneRender).positionFbo,_x,local_1d0,_width,fVar57);
        _local_158 = (vec2)&aStack_148;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"u_scenePosition","");
        iVar35 = vera::getWindowHeight();
        vera::text((string *)&local_158,_x - _width,((float)iVar35 - local_1d0) - fVar57,(Font *)0x0
                  );
        if (_local_158 != (vec2)&aStack_148) {
          operator_delete((void *)_local_158,
                          CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                   aStack_148._M_allocated_capacity._0_4_) + 1);
        }
        local_1d0 = local_1d0 - (fVar57 + fVar57);
      }
      _local_158 = (vec2)&aStack_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"u_sceneNormal","");
      pmVar40 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                ::operator[](pUVar2,(key_type *)&local_158);
      bVar33 = pmVar40->present;
      if (_local_158 != (vec2)&aStack_148) {
        operator_delete((void *)_local_158,
                        CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                 aStack_148._M_allocated_capacity._0_4_) + 1);
      }
      if (bVar33 != false) {
        vera::image(&(this->m_sceneRender).normalFbo,_x,local_1d0,_width,fVar57);
        _local_158 = (vec2)&aStack_148;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"u_sceneNormal","");
        iVar35 = vera::getWindowHeight();
        vera::text((string *)&local_158,_x - _width,((float)iVar35 - local_1d0) - fVar57,(Font *)0x0
                  );
        if (_local_158 != (vec2)&aStack_148) {
          operator_delete((void *)_local_158,
                          CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                   aStack_148._M_allocated_capacity._0_4_) + 1);
        }
        local_1d0 = local_1d0 - (fVar57 + fVar57);
      }
      local_178[0] = (long *)0x0;
      ppFVar46 = (this->m_sceneRender).buffersFbo.
                 super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((this->m_sceneRender).buffersFbo.
          super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppFVar46) {
        auVar63._0_8_ = -(double)fVar57;
        auVar63._8_4_ = 0;
        auVar63._12_4_ = 0x80000000;
        uStack_180 = auVar63._8_8_;
        local_188 = auVar63._0_8_ + auVar63._0_8_;
        do {
          vera::image(ppFVar46[(long)local_178[0]],_x,local_1d0,_width,fVar57);
          vera::toString<unsigned_long>(&local_1a8,(unsigned_long *)local_178);
          pvVar41 = (vec2 *)std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,0x2dfd9d);
          vVar52 = (vec2)(pvVar41 + 2);
          if (*pvVar41 == vVar52) {
            aStack_148._8_8_ = pvVar41[3];
            aStack_148._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar52;
            aStack_148._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar52 >> 0x20);
            _local_158 = (vec2)&aStack_148;
          }
          else {
            aStack_148._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar52;
            aStack_148._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar52 >> 0x20);
            _local_158 = *pvVar41;
          }
          aStack_150 = pvVar41[1].field_0;
          aStack_14c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
                       pvVar41[1].field_1;
          *pvVar41 = vVar52;
          pvVar41[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
          pvVar41[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
          *(undefined1 *)&pvVar41[2].field_0 = 0;
          iVar35 = vera::getWindowHeight();
          vera::text((string *)&local_158,_x - _width,((float)iVar35 - local_1d0) - fVar57,
                     (Font *)0x0);
          if (_local_158 != (vec2)&aStack_148) {
            operator_delete((void *)_local_158,
                            CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                     aStack_148._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          local_1d0 = (float)((double)local_1d0 + local_188);
          local_178[0] = (long *)((long)local_178[0] + 1);
          ppFVar46 = (this->m_sceneRender).buffersFbo.
                     super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
        } while (local_178[0] <
                 (long *)((long)(this->m_sceneRender).buffersFbo.
                                super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)ppFVar46 >> 3));
      }
      _local_158 = (vec2)&aStack_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"u_scene","");
      pUVar2 = local_90;
      pmVar40 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                ::operator[](local_90,(key_type *)&local_158);
      this_01 = local_a0;
      bVar33 = pmVar40->present;
      if (_local_158 != (vec2)&aStack_148) {
        operator_delete((void *)_local_158,
                        CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                 aStack_148._M_allocated_capacity._0_4_) + 1);
      }
      if (bVar33 != false) {
        vera::image(&(this->m_sceneRender).renderFbo,_x,local_1d0,_width,fVar57);
        _local_158 = (vec2)&aStack_148;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"u_scene","");
        iVar35 = vera::getWindowHeight();
        vera::text((string *)&local_158,_x - _width,((float)iVar35 - local_1d0) - fVar57,(Font *)0x0
                  );
        if (_local_158 != (vec2)&aStack_148) {
          operator_delete((void *)_local_158,
                          CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                   aStack_148._M_allocated_capacity._0_4_) + 1);
        }
        local_1d0 = local_1d0 - (fVar57 + fVar57);
      }
      _local_158 = (vec2)&aStack_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"u_sceneDepth","");
      pmVar40 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                ::operator[](pUVar2,(key_type *)&local_158);
      bVar33 = pmVar40->present;
      if (_local_158 != (vec2)&aStack_148) {
        operator_delete((void *)_local_158,
                        CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                 aStack_148._M_allocated_capacity._0_4_) + 1);
      }
      if (bVar33 != false) {
        vera::fill(0.0);
        pCVar50 = (this->uniforms).super_Scene.activeCamera;
        if (pCVar50 != (Camera *)0x0) {
          (*(pCVar50->super_Node)._vptr_Node[0x4d])();
          (*(((this->uniforms).super_Scene.activeCamera)->super_Node)._vptr_Node[0x4e])();
          vera::imageDepth(&(this->m_sceneRender).renderFbo,_x,local_1d0,_width,fVar57,_far,_near);
        }
        _local_158 = (vec2)&aStack_148;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"u_sceneDepth","");
        iVar35 = vera::getWindowHeight();
        vera::text((string *)&local_158,_x - _width,((float)iVar35 - local_1d0) - fVar57,(Font *)0x0
                  );
        if (_local_158 != (vec2)&aStack_148) {
          operator_delete((void *)_local_158,
                          CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                   aStack_148._M_allocated_capacity._0_4_) + 1);
        }
        vera::fill(1.0);
      }
    }
    if ((this->uniforms).tracker.m_running == true) {
      _local_158 = (vec2)&aStack_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"renderUI:buffers","");
      Tracker::end(this_01,(string *)&local_158);
      if (_local_158 != (vec2)&aStack_148) {
        operator_delete((void *)_local_158,
                        CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                 aStack_148._M_allocated_capacity._0_4_) + 1);
      }
    }
  }
  if ((this->m_plot != PLOT_OFF) && (this->m_plot_texture != (Texture *)0x0)) {
    glDisable();
    if ((this->uniforms).tracker.m_running == true) {
      _local_158 = (vec2)&aStack_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"renderUI:plot_data","");
      Tracker::begin(this_01,(string *)&local_158);
      if (_local_158 != (vec2)&aStack_148) {
        operator_delete((void *)_local_158,
                        CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                 aStack_148._M_allocated_capacity._0_4_) + 1);
      }
    }
    fVar57 = vera::getPixelDensity(false);
    iVar35 = vera::getWindowWidth();
    pSVar49 = &this->m_plot_shader;
    vera::Shader::use(pSVar49);
    _local_158 = (vec2)&aStack_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"u_scale","");
    fVar64 = fVar57 * 30.0;
    local_188 = (double)CONCAT44(local_188._4_4_,fVar57 * 100.0);
    vera::Shader::setUniform(pSVar49,(string *)&local_158,fVar57 * 100.0,fVar64);
    if (_local_158 != (vec2)&aStack_148) {
      operator_delete((void *)_local_158,
                      CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                               aStack_148._M_allocated_capacity._0_4_) + 1);
    }
    _local_158 = (vec2)&aStack_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"u_translate","");
    vera::Shader::setUniform(pSVar49,(string *)&local_158,(float)iVar35 * 0.5,fVar64 + 10.0);
    if (_local_158 != (vec2)&aStack_148) {
      operator_delete((void *)_local_158,
                      CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                               aStack_148._M_allocated_capacity._0_4_) + 1);
    }
    _local_158 = (vec2)&aStack_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"u_resolution","");
    iVar35 = vera::getWindowWidth();
    iVar34 = vera::getWindowHeight();
    vera::Shader::setUniform(pSVar49,(string *)&local_158,(float)iVar35,(float)iVar34);
    if (_local_158 != (vec2)&aStack_148) {
      operator_delete((void *)_local_158,
                      CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                               aStack_148._M_allocated_capacity._0_4_) + 1);
    }
    _local_158 = (vec2)&aStack_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"u_viewport","");
    vera::Shader::setUniform(pSVar49,(string *)&local_158,(float)local_188,fVar64);
    if (_local_158 != (vec2)&aStack_148) {
      operator_delete((void *)_local_158,
                      CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                               aStack_148._M_allocated_capacity._0_4_) + 1);
    }
    _local_158 = (vec2)&aStack_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"u_model","");
    vera::Shader::setUniform(pSVar49,(string *)&local_158,1.0,1.0,1.0);
    if (_local_158 != (vec2)&aStack_148) {
      operator_delete((void *)_local_158,
                      CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                               aStack_148._M_allocated_capacity._0_4_) + 1);
    }
    paVar3 = &local_1a8.field_2;
    local_1a8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"u_modelMatrix","");
    local_158.x = 1.0;
    aStack_154.y = 0.0;
    aStack_150 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
    aStack_14c.w = 0.0;
    aStack_148._M_allocated_capacity._0_4_ = 0;
    aStack_148._M_allocated_capacity._4_4_ = 0x3f800000;
    aStack_148._8_8_ = 0;
    pvStack_138 = (pointer)0x0;
    local_130.z = 1.0;
    local_12c.w = 0.0;
    aStack_128.x = 0.0;
    uStack_124._0_4_ = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    uStack_124._4_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    local_11c.w = 1.0;
    vera::Shader::setUniform(pSVar49,&local_1a8,(mat4 *)&local_158,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    local_1a8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"u_viewMatrix","");
    local_158.x = 1.0;
    aStack_154.y = 0.0;
    aStack_150 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
    aStack_14c.w = 0.0;
    aStack_148._M_allocated_capacity._0_4_ = 0;
    aStack_148._M_allocated_capacity._4_4_ = 0x3f800000;
    aStack_148._8_8_ = 0;
    pvStack_138 = (pointer)0x0;
    local_130.z = 1.0;
    local_12c.w = 0.0;
    aStack_128.x = 0.0;
    uStack_124._0_4_ = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    uStack_124._4_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    local_11c.w = 1.0;
    vera::Shader::setUniform(pSVar49,&local_1a8,(mat4 *)&local_158,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    local_1a8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"u_projectionMatrix","");
    local_158.x = 1.0;
    aStack_154.y = 0.0;
    aStack_150.x = 0.0;
    aStack_14c.w = 0.0;
    aStack_148._M_allocated_capacity._0_4_ = 0;
    aStack_148._M_allocated_capacity._4_4_ = 0x3f800000;
    aStack_148._8_8_ = 0;
    pvStack_138 = (pointer)0x0;
    local_130.z = 1.0;
    local_12c.w = 0.0;
    aStack_128.x = 0.0;
    uStack_124._0_4_ = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    uStack_124._4_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    local_11c.w = 1.0;
    vera::Shader::setUniform(pSVar49,&local_1a8,(mat4 *)&local_158,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    _local_158 = (vec2)&aStack_148;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"u_modelViewProjectionMatrix","");
    pmVar47 = vera::getOrthoMatrix();
    vera::Shader::setUniform(pSVar49,(string *)&local_158,pmVar47,false);
    if (_local_158 != (vec2)&aStack_148) {
      operator_delete((void *)_local_158,
                      CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                               aStack_148._M_allocated_capacity._0_4_) + 1);
    }
    _local_158 = (vec2)&aStack_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"u_plotData","");
    vera::Shader::setUniformTexture(pSVar49,(string *)&local_158,this->m_plot_texture,0);
    if (_local_158 != (vec2)&aStack_148) {
      operator_delete((void *)_local_158,
                      CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                               aStack_148._M_allocated_capacity._0_4_) + 1);
    }
    pVVar48 = vera::getBillboard();
    vera::Vbo::render(pVVar48,pSVar49);
    if ((this->uniforms).tracker.m_running == true) {
      _local_158 = (vec2)&aStack_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"renderUI:plot_data","");
      Tracker::end(this_01,(string *)&local_158);
      if (_local_158 != (vec2)&aStack_148) {
        operator_delete((void *)_local_158,
                        CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                 aStack_148._M_allocated_capacity._0_4_) + 1);
      }
    }
  }
  if (this->cursor == true) {
    bVar33 = vera::getMouseEntered();
    if (bVar33) {
      if ((this->uniforms).tracker.m_running == true) {
        _local_158 = (vec2)&aStack_148;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"renderUI:cursor","");
        Tracker::begin(this_01,(string *)&local_158);
        if (_local_158 != (vec2)&aStack_148) {
          operator_delete((void *)_local_158,
                          CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                   aStack_148._M_allocated_capacity._0_4_) + 1);
        }
      }
      if ((this->m_cross_vbo)._M_t.super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>
          ._M_t.super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
          super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl == (Vbo *)0x0) {
        this_00 = (Vbo *)operator_new(0x60);
        local_1a8._M_dataplus._M_p = (pointer)0x0;
        local_1a8._M_string_length = local_1a8._M_string_length & 0xffffffff00000000;
        vera::crossMesh((Mesh *)&local_158,(vec3 *)&local_1a8,10.0);
        vera::Vbo::Vbo(this_00,(Mesh *)&local_158);
        pVVar48 = (this->m_cross_vbo)._M_t.
                  super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>._M_t.
                  super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
                  super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl;
        (this->m_cross_vbo)._M_t.super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>.
        _M_t.super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
        super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl = this_00;
        if (pVVar48 != (Vbo *)0x0) {
          (*pVVar48->_vptr_Vbo[1])();
        }
        vera::Mesh::~Mesh((Mesh *)&local_158);
      }
      pSVar49 = vera::getFillShader();
      vera::Shader::use(pSVar49);
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1a8,"u_modelViewProjectionMatrix","");
      pmVar47 = vera::getOrthoMatrix();
      fVar57 = vera::getMouseX();
      fVar64 = vera::getMouseY();
      uVar23 = pmVar47->value[0].field_0;
      uVar24 = pmVar47->value[0].field_1;
      uVar25 = pmVar47->value[0].field_2;
      uVar26 = pmVar47->value[0].field_3;
      uVar27 = pmVar47->value[1].field_0;
      uVar28 = pmVar47->value[1].field_1;
      aStack_148._8_4_ = pmVar47->value[1].field_2;
      aStack_148._12_4_ = pmVar47->value[1].field_3;
      pvStack_138 = *(pointer *)(pmVar47->value + 2);
      uVar29 = pmVar47->value[2].field_2;
      uVar30 = pmVar47->value[2].field_3;
      uVar4 = pmVar47->value[0].field_0;
      uVar12 = pmVar47->value[0].field_1;
      uVar5 = pmVar47->value[0].field_2;
      uVar13 = pmVar47->value[0].field_3;
      uVar6 = pmVar47->value[1].field_0;
      uVar14 = pmVar47->value[1].field_1;
      uVar7 = pmVar47->value[1].field_2;
      uVar15 = pmVar47->value[1].field_3;
      uVar8 = pmVar47->value[2].field_0;
      uVar16 = pmVar47->value[2].field_1;
      uVar9 = pmVar47->value[2].field_2;
      uVar17 = pmVar47->value[2].field_3;
      uVar10 = pmVar47->value[3].field_0;
      uVar18 = pmVar47->value[3].field_1;
      aStack_128.x = (float)uVar10 +
                     (float)uVar8 * 0.0 + (float)uVar6 * fVar64 + (float)uVar4 * fVar57;
      uVar11 = pmVar47->value[3].field_2;
      uVar19 = pmVar47->value[3].field_3;
      local_11c.w = (float)uVar19 +
                    (float)uVar17 * 0.0 + fVar64 * (float)uVar15 + fVar57 * (float)uVar13;
      uStack_124._4_4_ =
           (float)uVar11 + (float)uVar9 * 0.0 + fVar64 * (float)uVar7 + fVar57 * (float)uVar5;
      uStack_124._0_4_ =
           (float)uVar18 + (float)uVar16 * 0.0 + (float)uVar14 * fVar64 + (float)uVar12 * fVar57;
      local_158 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)uVar23;
      aStack_154 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)uVar24;
      aStack_150 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)uVar25;
      aStack_14c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uVar26;
      aStack_148._M_allocated_capacity._0_4_ = uVar27;
      aStack_148._M_allocated_capacity._4_4_ = uVar28;
      local_130 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)uVar29;
      local_12c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uVar30;
      vera::Shader::setUniform(pSVar49,&local_1a8,(mat4 *)&local_158,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      _local_158 = (vec2)&aStack_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"u_color","");
      vera::Shader::setUniform(pSVar49,(string *)&local_158,1.0,1.0,1.0,1.0);
      if (_local_158 != (vec2)&aStack_148) {
        operator_delete((void *)_local_158,
                        CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                 aStack_148._M_allocated_capacity._0_4_) + 1);
      }
      vera::Vbo::render((this->m_cross_vbo)._M_t.
                        super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>._M_t.
                        super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
                        super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl,pSVar49);
      if ((this->uniforms).tracker.m_running == true) {
        _local_158 = (vec2)&aStack_148;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"renderUI:cursor","");
        Tracker::end(this_01,(string *)&local_158);
        if (_local_158 != (vec2)&aStack_148) {
          operator_delete((void *)_local_158,
                          CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                   aStack_148._M_allocated_capacity._0_4_) + 1);
        }
      }
    }
  }
  if (((this->frag_index == -1) && (this->vert_index == -1)) && (this->geom_index == -1)) {
    WVar37 = vera::getWindowStyle();
    if (WVar37 != EMBEDDED) {
      iVar35 = vera::getWindowWidth();
      iVar34 = vera::getWindowHeight();
      pCVar50 = vera::getCamera();
      vera::resetCamera();
      vera::fill(0.0,0.0,0.0,0.75);
      vera::noStroke();
      fVar57 = (float)iVar34;
      local_158.x = (float)iVar35 * 0.5;
      aStack_154.y = fVar57 * 0.5;
      local_188 = (double)CONCAT44(aStack_154,local_158);
      uStack_180 = 0;
      local_1a8._M_dataplus._M_p =
           (pointer)CONCAT44((float)iVar34 * -0.05 + (float)iVar34 * -0.05 + fVar57,
                             (float)iVar35 * -0.05 + (float)iVar35 * -0.05 + (float)iVar35);
      vera::rect((vec2 *)&local_158,(vec2 *)&local_1a8,(Shader *)0x0);
      vera::fill(1.0);
      vera::textAngle(0.0,(Font *)0x0);
      vera::textAlign(ALIGN_MIDDLE,(Font *)0x0);
      vera::textAlign(ALIGN_CENTER,(Font *)0x0);
      vera::textSize(38.0,(Font *)0x0);
      _local_158 = (vec2)&aStack_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"Drag & Drop","");
      vera::text((string *)&local_158,(float)local_188,fVar57 * 0.45,(Font *)0x0);
      this_01 = local_a0;
      if (_local_158 != (vec2)&aStack_148) {
        operator_delete((void *)_local_158,
                        CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                 aStack_148._M_allocated_capacity._0_4_) + 1);
      }
      vera::textSize(22.0,(Font *)0x0);
      _local_158 = (vec2)&aStack_148;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,".vert .frag .ply .lst .obj .gltf .glb","");
      vera::text((string *)&local_158,(float)local_188,fVar57 * 0.55,(Font *)0x0);
      if (_local_158 != (vec2)&aStack_148) {
        operator_delete((void *)_local_158,
                        CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                 aStack_148._M_allocated_capacity._0_4_) + 1);
      }
      vera::setCamera(pCVar50);
    }
  }
  if (this->help == true) {
    iVar35 = vera::getWindowWidth();
    iVar34 = vera::getWindowHeight();
    pCVar50 = vera::getCamera();
    vera::resetCamera();
    vera::fill(0.0,0.0,0.0,0.75);
    vera::noStroke();
    local_158.x = (float)iVar35 * 0.5;
    aStack_154.y = (float)iVar34 * 0.5;
    fVar57 = (float)iVar35 * 0.05;
    fVar64 = (float)iVar34 * 0.05;
    local_188 = (double)CONCAT44(fVar64,fVar57 + fVar57);
    uStack_180 = 0;
    local_1c8 = fVar64 * 3.0;
    local_1a8._M_dataplus._M_p =
         (pointer)CONCAT44((float)iVar34 - (fVar64 + fVar64),(float)iVar35 - (fVar57 + fVar57));
    vera::rect((vec2 *)&local_158,(vec2 *)&local_1a8,(Shader *)0x0);
    vera::fill(1.0);
    vera::textAlign(ALIGN_MIDDLE,(Font *)0x0);
    vera::textAlign(ALIGN_LEFT,(Font *)0x0);
    vera::textAngle(0.0,(Font *)0x0);
    vera::textSize(22.0,(Font *)0x0);
    fVar57 = vera::getFontHeight();
    fVar57 = fVar57 * 1.5;
    local_a8 = pCVar50;
    if (this->geom_index != -1) {
      bVar33 = (this->m_sceneRender).showAxis != false;
      pcVar54 = "show";
      pcVar55 = "show";
      if (bVar33) {
        pcVar55 = "hide";
      }
      local_178[0] = local_168;
      pcVar32 = "show";
      pcVar31 = "show";
      if (bVar33) {
        pcVar31 = "hide";
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)local_178,pcVar55,pcVar31 + 4);
      plVar51 = (long *)std::__cxx11::string::replace((ulong)local_178,0,(char *)0x0,0x2df079);
      paVar3 = &local_1a8.field_2;
      psVar53 = (size_type *)(plVar51 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar51 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar53) {
        local_1a8.field_2._M_allocated_capacity = *psVar53;
        local_1a8.field_2._8_8_ = plVar51[3];
        local_1a8._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *psVar53;
        local_1a8._M_dataplus._M_p = (pointer)*plVar51;
      }
      local_1a8._M_string_length = plVar51[1];
      *plVar51 = (long)psVar53;
      plVar51[1] = 0;
      *(undefined1 *)(plVar51 + 2) = 0;
      pvVar41 = (vec2 *)std::__cxx11::string::append((char *)&local_1a8);
      vVar52 = (vec2)(pvVar41 + 2);
      if (*pvVar41 == vVar52) {
        aStack_148._8_8_ = pvVar41[3];
        aStack_148._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar52;
        aStack_148._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar52 >> 0x20);
        _local_158 = (vec2)&aStack_148;
      }
      else {
        aStack_148._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar52;
        aStack_148._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar52 >> 0x20);
        _local_158 = *pvVar41;
      }
      aStack_150 = pvVar41[1].field_0;
      aStack_14c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
                   pvVar41[1].field_1;
      *pvVar41 = vVar52;
      pvVar41[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
      pvVar41[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
      *(undefined1 *)&pvVar41[2].field_0 = 0;
      vera::text((string *)&local_158,(float)local_188,local_1c8,(Font *)0x0);
      if (_local_158 != (vec2)&aStack_148) {
        operator_delete((void *)_local_158,
                        CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                 aStack_148._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar3) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      if (local_178[0] != local_168) {
        operator_delete(local_178[0],local_168[0] + 1);
      }
      bVar33 = (this->m_sceneRender).showBBoxes != false;
      if (bVar33) {
        pcVar54 = "hide";
      }
      local_178[0] = local_168;
      if (bVar33) {
        pcVar32 = "hide";
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)local_178,pcVar54,pcVar32 + 4);
      plVar51 = (long *)std::__cxx11::string::replace((ulong)local_178,0,(char *)0x0,0x2df088);
      psVar53 = (size_type *)(plVar51 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar51 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar53) {
        local_1a8.field_2._M_allocated_capacity = *psVar53;
        local_1a8.field_2._8_8_ = plVar51[3];
        local_1a8._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *psVar53;
        local_1a8._M_dataplus._M_p = (pointer)*plVar51;
      }
      local_1a8._M_string_length = plVar51[1];
      *plVar51 = (long)psVar53;
      plVar51[1] = 0;
      *(undefined1 *)(plVar51 + 2) = 0;
      pvVar41 = (vec2 *)std::__cxx11::string::append((char *)&local_1a8);
      vVar52 = (vec2)(pvVar41 + 2);
      if (*pvVar41 == vVar52) {
        aStack_148._8_8_ = pvVar41[3];
        aStack_148._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar52;
        aStack_148._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar52 >> 0x20);
        _local_158 = (vec2)&aStack_148;
      }
      else {
        aStack_148._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar52;
        aStack_148._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar52 >> 0x20);
        _local_158 = *pvVar41;
      }
      aStack_150 = pvVar41[1].field_0;
      aStack_14c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
                   pvVar41[1].field_1;
      *pvVar41 = vVar52;
      pvVar41[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
      pvVar41[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
      *(undefined1 *)&pvVar41[2].field_0 = 0;
      vera::text((string *)&local_158,(float)local_188,local_1c8 + fVar57,(Font *)0x0);
      if (_local_158 != (vec2)&aStack_148) {
        operator_delete((void *)_local_158,
                        CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                 aStack_148._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar3) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      if (local_178[0] != local_168) {
        operator_delete(local_178[0],local_168[0] + 1);
      }
      local_1c8 = local_1c8 + fVar57 + fVar57;
    }
    _local_158 = (vec2)&aStack_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"c - hide/show cursor","");
    vera::text((string *)&local_158,(float)local_188,local_1c8,(Font *)0x0);
    if (_local_158 != (vec2)&aStack_148) {
      operator_delete((void *)_local_158,
                      CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                               aStack_148._M_allocated_capacity._0_4_) + 1);
    }
    local_1c8 = local_1c8 + fVar57;
    if (this->geom_index != -1) {
      uVar44 = (ulong)(this->m_sceneRender).dynamicShadows;
      pcVar54 = "enable";
      if (uVar44 != 0) {
        pcVar54 = "disable";
      }
      local_178[0] = local_168;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_178,pcVar54,pcVar54 + uVar44 + 6);
      plVar51 = (long *)std::__cxx11::string::replace((ulong)local_178,0,(char *)0x0,0x2df0a2);
      psVar53 = (size_type *)(plVar51 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar51 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar53) {
        local_1a8.field_2._M_allocated_capacity = *psVar53;
        local_1a8.field_2._8_8_ = plVar51[3];
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *psVar53;
        local_1a8._M_dataplus._M_p = (pointer)*plVar51;
      }
      local_1a8._M_string_length = plVar51[1];
      *plVar51 = (long)psVar53;
      plVar51[1] = 0;
      *(undefined1 *)(plVar51 + 2) = 0;
      pvVar41 = (vec2 *)std::__cxx11::string::append((char *)&local_1a8);
      vVar52 = (vec2)(pvVar41 + 2);
      if (*pvVar41 == vVar52) {
        aStack_148._8_8_ = pvVar41[3];
        aStack_148._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar52;
        aStack_148._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar52 >> 0x20);
        _local_158 = (vec2)&aStack_148;
      }
      else {
        aStack_148._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar52;
        aStack_148._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar52 >> 0x20);
        _local_158 = *pvVar41;
      }
      aStack_150 = pvVar41[1].field_0;
      aStack_14c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
                   pvVar41[1].field_1;
      *pvVar41 = vVar52;
      pvVar41[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
      pvVar41[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
      *(undefined1 *)&pvVar41[2].field_0 = 0;
      vera::text((string *)&local_158,(float)local_188,local_1c8,(Font *)0x0);
      if (_local_158 != (vec2)&aStack_148) {
        operator_delete((void *)_local_158,
                        CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                 aStack_148._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      if (local_178[0] != local_168) {
        operator_delete(local_178[0],local_168[0] + 1);
      }
      _local_158 = (vec2)&aStack_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"f - hide/show floor","")
      ;
      vera::text((string *)&local_158,(float)local_188,local_1c8 + fVar57,(Font *)0x0);
      if (_local_158 != (vec2)&aStack_148) {
        operator_delete((void *)_local_158,
                        CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                 aStack_148._M_allocated_capacity._0_4_) + 1);
      }
      local_1c8 = local_1c8 + fVar57 + fVar57;
    }
    bVar33 = vera::isFullscreen();
    pcVar55 = "enable";
    pcVar54 = "enable";
    if (bVar33) {
      pcVar54 = "disable";
    }
    local_178[0] = local_168;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,pcVar54,pcVar54 + (ulong)bVar33 + 6);
    plVar51 = (long *)std::__cxx11::string::replace((ulong)local_178,0,(char *)0x0,0x2df0ca);
    paVar3 = &local_1a8.field_2;
    psVar53 = (size_type *)(plVar51 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar51 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar53) {
      local_1a8.field_2._M_allocated_capacity = *psVar53;
      local_1a8.field_2._8_8_ = plVar51[3];
      local_1a8._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_1a8.field_2._M_allocated_capacity = *psVar53;
      local_1a8._M_dataplus._M_p = (pointer)*plVar51;
    }
    local_1a8._M_string_length = plVar51[1];
    *plVar51 = (long)psVar53;
    plVar51[1] = 0;
    *(undefined1 *)(plVar51 + 2) = 0;
    pvVar41 = (vec2 *)std::__cxx11::string::append((char *)&local_1a8);
    vVar52 = (vec2)(pvVar41 + 2);
    if (*pvVar41 == vVar52) {
      aStack_148._8_8_ = pvVar41[3];
      aStack_148._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar52;
      aStack_148._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar52 >> 0x20);
      _local_158 = (vec2)&aStack_148;
    }
    else {
      aStack_148._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar52;
      aStack_148._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar52 >> 0x20);
      _local_158 = *pvVar41;
    }
    aStack_150 = pvVar41[1].field_0;
    aStack_14c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)pvVar41[1].field_1;
    *pvVar41 = vVar52;
    pvVar41[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
    pvVar41[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
    *(undefined1 *)&pvVar41[2].field_0 = 0;
    vera::text((string *)&local_158,(float)local_188,local_1c8,(Font *)0x0);
    if (_local_158 != (vec2)&aStack_148) {
      operator_delete((void *)_local_158,
                      CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                               aStack_148._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if (local_178[0] != local_168) {
      operator_delete(local_178[0],local_168[0] + 1);
    }
    local_1c8 = local_1c8 + fVar57;
    if (this->geom_index != -1) {
      pcVar54 = "show";
      bVar33 = (this->m_sceneRender).showGrid != false;
      if (bVar33) {
        pcVar54 = "hide";
      }
      pcVar31 = "show";
      if (bVar33) {
        pcVar31 = "hide";
      }
      local_178[0] = local_168;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_178,pcVar54,pcVar31 + 4);
      plVar51 = (long *)std::__cxx11::string::replace((ulong)local_178,0,(char *)0x0,0x2df0cf);
      psVar53 = (size_type *)(plVar51 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar51 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar53) {
        local_1a8.field_2._M_allocated_capacity = *psVar53;
        local_1a8.field_2._8_8_ = plVar51[3];
        local_1a8._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *psVar53;
        local_1a8._M_dataplus._M_p = (pointer)*plVar51;
      }
      local_1a8._M_string_length = plVar51[1];
      *plVar51 = (long)psVar53;
      plVar51[1] = 0;
      *(undefined1 *)(plVar51 + 2) = 0;
      pvVar41 = (vec2 *)std::__cxx11::string::append((char *)&local_1a8);
      vVar52 = (vec2)(pvVar41 + 2);
      if (*pvVar41 == vVar52) {
        aStack_148._8_8_ = pvVar41[3];
        aStack_148._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar52;
        aStack_148._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar52 >> 0x20);
        _local_158 = (vec2)&aStack_148;
      }
      else {
        aStack_148._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar52;
        aStack_148._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar52 >> 0x20);
        _local_158 = *pvVar41;
      }
      aStack_150 = pvVar41[1].field_0;
      aStack_14c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
                   pvVar41[1].field_1;
      *pvVar41 = vVar52;
      pvVar41[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
      pvVar41[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
      *(undefined1 *)&pvVar41[2].field_0 = 0;
      vera::text((string *)&local_158,(float)local_188,local_1c8,(Font *)0x0);
      if (_local_158 != (vec2)&aStack_148) {
        operator_delete((void *)_local_158,
                        CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                 aStack_148._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar3) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      if (local_178[0] != local_168) {
        operator_delete(local_178[0],local_168[0] + 1);
      }
      local_1c8 = local_1c8 + fVar57;
    }
    pcVar54 = "show";
    bVar33 = this->help != false;
    if (bVar33) {
      pcVar54 = "hide";
    }
    pcVar31 = "show";
    if (bVar33) {
      pcVar31 = "hide";
    }
    local_178[0] = local_168;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_178,pcVar54,pcVar31 + 4);
    plVar51 = (long *)std::__cxx11::string::replace((ulong)local_178,0,(char *)0x0,0x2df0d4);
    psVar53 = (size_type *)(plVar51 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar51 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar53) {
      local_1a8.field_2._M_allocated_capacity = *psVar53;
      local_1a8.field_2._8_8_ = plVar51[3];
      local_1a8._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_1a8.field_2._M_allocated_capacity = *psVar53;
      local_1a8._M_dataplus._M_p = (pointer)*plVar51;
    }
    local_1a8._M_string_length = plVar51[1];
    *plVar51 = (long)psVar53;
    plVar51[1] = 0;
    *(undefined1 *)(plVar51 + 2) = 0;
    pvVar41 = (vec2 *)std::__cxx11::string::append((char *)&local_1a8);
    vVar52 = (vec2)(pvVar41 + 2);
    if (*pvVar41 == vVar52) {
      aStack_148._8_8_ = pvVar41[3];
      aStack_148._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar52;
      aStack_148._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar52 >> 0x20);
      _local_158 = (vec2)&aStack_148;
    }
    else {
      aStack_148._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar52;
      aStack_148._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar52 >> 0x20);
      _local_158 = *pvVar41;
    }
    aStack_150 = pvVar41[1].field_0;
    aStack_14c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)pvVar41[1].field_1;
    *pvVar41 = vVar52;
    pvVar41[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
    pvVar41[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
    *(undefined1 *)&pvVar41[2].field_0 = 0;
    vera::text((string *)&local_158,(float)local_188,local_1c8,(Font *)0x0);
    if (_local_158 != (vec2)&aStack_148) {
      operator_delete((void *)_local_158,
                      CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                               aStack_148._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if (local_178[0] != local_168) {
      operator_delete(local_178[0],local_168[0] + 1);
    }
    _local_158 = (vec2)&aStack_148;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"i - hide/show extra info","");
    vera::text((string *)&local_158,(float)local_188,local_1c8 + fVar57,(Font *)0x0);
    if (_local_158 != (vec2)&aStack_148) {
      operator_delete((void *)_local_158,
                      CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                               aStack_148._M_allocated_capacity._0_4_) + 1);
    }
    _local_158 = (vec2)&aStack_148;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"o - open shaders on default editor","");
    fVar64 = local_1c8 + fVar57 + fVar57;
    vera::text((string *)&local_158,(float)local_188,fVar64,(Font *)0x0);
    if (_local_158 != (vec2)&aStack_148) {
      operator_delete((void *)_local_158,
                      CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                               aStack_148._M_allocated_capacity._0_4_) + 1);
    }
    _local_158 = (vec2)&aStack_148;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"p - hide/show render passes/buffers","");
    fVar64 = fVar64 + fVar57;
    vera::text((string *)&local_158,(float)local_188,fVar64,(Font *)0x0);
    if (_local_158 != (vec2)&aStack_148) {
      operator_delete((void *)_local_158,
                      CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                               aStack_148._M_allocated_capacity._0_4_) + 1);
    }
    fVar64 = fVar64 + fVar57;
    if ((this->uniforms).super_Scene.streams._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
    {
      _local_158 = (vec2)&aStack_148;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"r - restart stream textures","");
      vera::text((string *)&local_158,(float)local_188,fVar64,(Font *)0x0);
      if (_local_158 != (vec2)&aStack_148) {
        operator_delete((void *)_local_158,
                        CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                 aStack_148._M_allocated_capacity._0_4_) + 1);
      }
      fVar64 = fVar64 + fVar57;
    }
    if (this->geom_index != -1) {
      _local_158 = (vec2)&aStack_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"s - hide/show sky","");
      vera::text((string *)&local_158,(float)local_188,fVar64,(Font *)0x0);
      if (_local_158 != (vec2)&aStack_148) {
        operator_delete((void *)_local_158,
                        CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                 aStack_148._M_allocated_capacity._0_4_) + 1);
      }
      fVar64 = fVar64 + fVar57;
    }
    _local_158 = (vec2)&aStack_148;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"t - hide/show loaded textures","");
    vera::text((string *)&local_158,(float)local_188,fVar64,(Font *)0x0);
    if (_local_158 != (vec2)&aStack_148) {
      operator_delete((void *)_local_158,
                      CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                               aStack_148._M_allocated_capacity._0_4_) + 1);
    }
    if ((ulong)this->verbose != 0) {
      pcVar55 = "disable";
    }
    local_178[0] = local_168;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,pcVar55,pcVar55 + (ulong)this->verbose + 6);
    plVar51 = (long *)std::__cxx11::string::replace((ulong)local_178,0,(char *)0x0,0x2df18b);
    psVar53 = (size_type *)(plVar51 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar51 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar53) {
      local_1a8.field_2._M_allocated_capacity = *psVar53;
      local_1a8.field_2._8_8_ = plVar51[3];
      local_1a8._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_1a8.field_2._M_allocated_capacity = *psVar53;
      local_1a8._M_dataplus._M_p = (pointer)*plVar51;
    }
    local_1a8._M_string_length = plVar51[1];
    *plVar51 = (long)psVar53;
    plVar51[1] = 0;
    *(undefined1 *)(plVar51 + 2) = 0;
    pvVar41 = (vec2 *)std::__cxx11::string::append((char *)&local_1a8);
    vVar52 = (vec2)(pvVar41 + 2);
    if (*pvVar41 == vVar52) {
      aStack_148._8_8_ = pvVar41[3];
      aStack_148._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar52;
      aStack_148._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar52 >> 0x20);
      _local_158 = (vec2)&aStack_148;
    }
    else {
      aStack_148._M_allocated_capacity._0_4_ = (undefined4)*(size_type *)vVar52;
      aStack_148._M_allocated_capacity._4_4_ = (undefined4)(*(size_type *)vVar52 >> 0x20);
      _local_158 = *pvVar41;
    }
    aStack_150 = pvVar41[1].field_0;
    aStack_14c = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)pvVar41[1].field_1;
    *pvVar41 = vVar52;
    pvVar41[1].field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
    pvVar41[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
    *(undefined1 *)&pvVar41[2].field_0 = 0;
    vera::text((string *)&local_158,(float)local_188,fVar64 + fVar57,(Font *)0x0);
    if (_local_158 != (vec2)&aStack_148) {
      operator_delete((void *)_local_158,
                      CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                               aStack_148._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if (local_178[0] != local_168) {
      operator_delete(local_178[0],local_168[0] + 1);
    }
    this_01 = local_a0;
    if ((this->uniforms).super_Scene.streams._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
    {
      _local_158 = (vec2)&aStack_148;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"space - start/stop stream textures","");
      vera::text((string *)&local_158,(float)local_188,fVar57 + fVar64 + fVar57,(Font *)0x0);
      if (_local_158 != (vec2)&aStack_148) {
        operator_delete((void *)_local_158,
                        CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                                 aStack_148._M_allocated_capacity._0_4_) + 1);
      }
    }
    vera::setCamera(local_a8);
    glDisable(0xb71);
  }
  if ((this->uniforms).tracker.m_running == true) {
    _local_158 = (vec2)&aStack_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"renderUI","");
    Tracker::end(this_01,(string *)&local_158);
    if (_local_158 != (vec2)&aStack_148) {
      operator_delete((void *)_local_158,
                      CONCAT44(aStack_148._M_allocated_capacity._4_4_,
                               aStack_148._M_allocated_capacity._0_4_) + 1);
    }
  }
  return;
}

Assistant:

void Sandbox::renderUI() {
    TRACK_BEGIN("renderUI")

    // // IN PUT TEXTURES
    if (m_showTextures) {      

        int nTotal = uniforms.textures.size();
        if (nTotal > 0) {
            glDisable(GL_DEPTH_TEST);
            TRACK_BEGIN("renderUI:textures")
            float w = (float)(vera::getWindowWidth());
            float h = (float)(vera::getWindowHeight());
            float a = h/w;
            float scale = fmin(1.0f / (float)(nTotal), 0.25) * 0.5;
            float xStep = w * scale * a;
            float yStep = h * scale;
            float xOffset = xStep;
            float yOffset = h - yStep;
            
            vera::textAngle(0.0);
            vera::textAlign(vera::ALIGN_TOP);
            vera::textAlign(vera::ALIGN_LEFT);
            vera::textSize(xStep * 0.2f / vera::getPixelDensity(false));

            for (vera::TexturesMap::iterator it = uniforms.textures.begin(); it != uniforms.textures.end(); it++) {
                float imgAspect = ((float)it->second->getWidth()/(float)it->second->getHeight());
                float imgW = xStep * imgAspect;
                vera::TextureStreamsMap::const_iterator slit = uniforms.streams.find(it->first);
                if ( slit != uniforms.streams.end() )
                    vera::image((vera::TextureStream*)slit->second, xStep * 0.5 + imgW * 0.5, yOffset, imgW, yStep, true);
                else 
                    vera::image(it->second, xStep * 0.5 + imgW * 0.5, yOffset, imgW, yStep);

                vera::text(it->first, 0, vera::getWindowHeight() - yOffset - yStep);

                yOffset -= yStep * 2.0;
            }
            TRACK_END("renderUI:textures")
        }
    }

    // RESULTING BUFFERS
    if (m_showPasses) {
        glDisable(GL_DEPTH_TEST);
        TRACK_BEGIN("renderUI:buffers")

        // DEBUG BUFFERS
        int nTotal = uniforms.buffers.size();
        nTotal += uniforms.doubleBuffers.size();
        nTotal += uniforms.pyramids.size();
        nTotal += uniforms.floods.size();
        if (uniforms.models.size() > 0 ) {
            nTotal += 1;
            nTotal += uniforms.functions["u_scene"].present;
            nTotal += uniforms.functions["u_sceneDepth"].present;
        }
        nTotal += uniforms.functions["u_sceneNormal"].present;
        nTotal += uniforms.functions["u_scenePosition"].present;
        nTotal += m_sceneRender.getBuffersTotal();
        
        if (nTotal > 0) {
            float w = (float)(vera::getWindowWidth());
            float h = (float)(vera::getWindowHeight());
            float scale = fmin(1.0f / (float)(nTotal), 0.25) * 0.5;
            float xStep = w * scale;
            float yStep = h * scale;
            float xOffset = w - xStep;
            float yOffset = h - yStep;

            vera::textAngle(0.0);
            vera::textSize(xStep * 0.2f / vera::getPixelDensity(false));
            vera::textAlign(vera::ALIGN_TOP);
            vera::textAlign(vera::ALIGN_LEFT);

            for (size_t i = 0; i < uniforms.buffers.size(); i++) {
                glm::vec2 offset = glm::vec2(xOffset, yOffset);
                glm::vec2 scale = glm::vec2(yStep);
                scale.x *= ((float)uniforms.buffers[i]->getWidth()/(float)uniforms.buffers[i]->getHeight());
                offset.x += xStep - scale.x;

                vera::image(uniforms.buffers[i], offset.x, offset.y, scale.x, scale.y);
                vera::text("u_buffer" + vera::toString(i), xOffset - scale.x, vera::getWindowHeight() - yOffset - yStep);

                yOffset -= yStep * 2.0;
            }

            for (size_t i = 0; i < uniforms.doubleBuffers.size(); i++) {
                glm::vec2 offset = glm::vec2(xOffset, yOffset);
                glm::vec2 scale = glm::vec2(yStep);
                scale.x *= ((float)uniforms.doubleBuffers[i]->src->getWidth()/(float)uniforms.doubleBuffers[i]->src->getHeight());
                offset.x += xStep - scale.x;

                vera::image(uniforms.doubleBuffers[i]->src, offset.x, offset.y, scale.x, scale.y);
                vera::text("u_doubleBuffer" + vera::toString(i), xOffset - scale.x, vera::getWindowHeight() - yOffset - yStep);

                yOffset -= yStep * 2.0;
            }

            for (size_t i = 0; i < uniforms.pyramids.size(); i++) {
                glm::vec2 offset = glm::vec2(xOffset, yOffset);
                glm::vec2 scale = glm::vec2(yStep);
                scale.x *= ((float)uniforms.pyramids[i].getWidth()/(float)uniforms.pyramids[i].getHeight());
                float w = scale.x;
                offset.x += xStep - w;
                for (size_t j = 0; j < uniforms.pyramids[i].getDepth() * 2; j++ ) {

                    if (j < uniforms.pyramids[i].getDepth())
                        vera::image(uniforms.pyramids[i].getResult(j), offset.x, offset.y, scale.x, scale.y);
                    else 
                        vera::image(uniforms.pyramids[i].getResult(j), offset.x + w * 2.0f, offset.y, scale.x, scale.y);

                    offset.x -= scale.x;
                    if (j < uniforms.pyramids[i].getDepth()) {
                        scale *= 0.5;
                        offset.y = yOffset - yStep * 0.5;
                    }
                    else {
                        offset.y = yOffset + yStep * 0.5;
                        scale *= 2.0;
                    }
                    offset.x -= scale.x;

                }

                vera::text("u_pyramid0" + vera::toString(i), xOffset - scale.x * 2.0, vera::getWindowHeight() - yOffset - yStep);
                yOffset -= yStep * 2.0;

            }

            for (size_t i = 0; i < uniforms.floods.size(); i++) {
                glm::vec2 offset = glm::vec2(xOffset, yOffset);
                glm::vec2 scale = glm::vec2(yStep);
                scale.x *= ((float)uniforms.floods[i].dst->getWidth()/(float)uniforms.floods[i].dst->getHeight());
                offset.x += xStep - scale.x;

                vera::image(uniforms.floods[i].dst, offset.x, offset.y, scale.x, scale.y);
                vera::text("u_flood" + vera::toString(i), xOffset - scale.x, vera::getWindowHeight() - yOffset - yStep);

                yOffset -= yStep * 2.0;
            }

            if (uniforms.models.size() > 0) {
                vera::fill(0.0);
                for (vera::LightsMap::iterator it = uniforms.lights.begin(); it != uniforms.lights.end(); ++it ) {
                    if ( it->second->getShadowMap()->isAllocated() && it->second->getShadowMap()->getDepthTextureId() ) {
                        vera::imageDepth(it->second->getShadowMap(), xOffset, yOffset, xStep, yStep, it->second->getShadowMapFar(), it->second->getShadowMapNear());
                        // vera::image(it->second->getShadowMap(), xOffset, yOffset, xStep, yStep);
                        vera::text("u_lightShadowMap", xOffset - xStep, vera::getWindowHeight() - yOffset - yStep);
                        yOffset -= yStep * 2.0;
                    }
                }
                vera::fill(1.0);
            }

            if (uniforms.functions["u_scenePosition"].present) {
                vera::image(&m_sceneRender.positionFbo, xOffset, yOffset, xStep, yStep);
                vera::text("u_scenePosition", xOffset - xStep, vera::getWindowHeight() - yOffset - yStep);
                yOffset -= yStep * 2.0;
            }

            if (uniforms.functions["u_sceneNormal"].present) {
                vera::image(&m_sceneRender.normalFbo, xOffset, yOffset, xStep, yStep);
                vera::text("u_sceneNormal", xOffset - xStep, vera::getWindowHeight() - yOffset - yStep);
                yOffset -= yStep * 2.0;
            }

            for (size_t i = 0; i < m_sceneRender.buffersFbo.size(); i++) {
                vera::image(m_sceneRender.buffersFbo[i], xOffset, yOffset, xStep, yStep);
                vera::text("u_sceneBuffer" + vera::toString(i), xOffset - xStep, vera::getWindowHeight() - yOffset - yStep);
                yOffset -= yStep * 2.0;
            }

            if (uniforms.functions["u_scene"].present) {
                vera::image(&m_sceneRender.renderFbo, xOffset, yOffset, xStep, yStep);
                vera::text("u_scene", xOffset - xStep, vera::getWindowHeight() - yOffset - yStep);
                yOffset -= yStep * 2.0;
            }

            if (uniforms.functions["u_sceneDepth"].present) {
                vera::fill(0.0);
                if (uniforms.activeCamera)
                    vera::imageDepth(&m_sceneRender.renderFbo, xOffset, yOffset, xStep, yStep, uniforms.activeCamera->getFarClip(), uniforms.activeCamera->getNearClip());
                vera::text("u_sceneDepth", xOffset - xStep, vera::getWindowHeight() - yOffset - yStep);
                yOffset -= yStep * 2.0;
                vera::fill(1.0);
            }
        }
        TRACK_END("renderUI:buffers")
    }

    if (m_plot != PLOT_OFF && m_plot_texture ) {
        glDisable(GL_DEPTH_TEST);
        TRACK_BEGIN("renderUI:plot_data")

        float p = vera::getPixelDensity();
        float w = 100 * p;
        float h = 30 * p;
        float x = (float)(vera::getWindowWidth()) * 0.5;
        float y = h + 10;

        m_plot_shader.use();
        m_plot_shader.setUniform("u_scale", w, h);
        m_plot_shader.setUniform("u_translate", x, y);
        m_plot_shader.setUniform("u_resolution", (float)vera::getWindowWidth(), (float)vera::getWindowHeight());
        m_plot_shader.setUniform("u_viewport", w, h);
        m_plot_shader.setUniform("u_model", glm::vec3(1.0f));
        m_plot_shader.setUniform("u_modelMatrix", glm::mat4(1.0f));
        m_plot_shader.setUniform("u_viewMatrix", glm::mat4(1.0f));
        m_plot_shader.setUniform("u_projectionMatrix", glm::mat4(1.0f));
        m_plot_shader.setUniform("u_modelViewProjectionMatrix", vera::getOrthoMatrix());
        m_plot_shader.setUniformTexture("u_plotData", m_plot_texture, 0);
        
        vera::getBillboard()->render(&m_plot_shader);
        TRACK_END("renderUI:plot_data")
    }

    if (cursor && vera::getMouseEntered()) {
        TRACK_BEGIN("renderUI:cursor")
        if (m_cross_vbo == nullptr)
            m_cross_vbo = std::unique_ptr<vera::Vbo>(new vera::Vbo( vera::crossMesh( glm::vec3(0.0f, 0.0f, 0.0f), 10.0f) ));

        vera::Shader* fill = vera::getFillShader();
        fill->use();
        fill->setUniform("u_modelViewProjectionMatrix", glm::translate(vera::getOrthoMatrix(), glm::vec3(vera::getMouseX(), vera::getMouseY(), 0.0f) ) );
        fill->setUniform("u_color", glm::vec4(1.0f));
        m_cross_vbo->render(fill);
        TRACK_END("renderUI:cursor")
    }

    if (frag_index == -1 && vert_index == -1 && geom_index == -1 && vera::getWindowStyle() != vera::EMBEDDED) {
        float w = (float)(vera::getWindowWidth());
        float h = (float)(vera::getWindowHeight());
        float xStep = w * 0.05;
        float yStep = h * 0.05;
        float x = xStep * 2.0f;
        float y = yStep * 3.0f;

        vera::Camera *cam = vera::getCamera();
        vera::resetCamera();

        vera::fill(0.0f, 0.0f, 0.0f, 0.75f);
        vera::noStroke();
        vera::rect(glm::vec2(w * 0.5f, h * 0.5f), glm::vec2(w - xStep * 2.0f, h - yStep * 2.0f));

        vera::fill(1.0f);

        vera::textAngle(0.0f);
        vera::textAlign(vera::ALIGN_MIDDLE);
        vera::textAlign(vera::ALIGN_CENTER);

        vera::textSize(38.0f);
        vera::text("Drag & Drop", w * 0.5f, h * 0.45f);

        vera::textSize(22.0f);
        vera::text(".vert .frag .ply .lst .obj .gltf .glb", w * 0.5f, h * 0.55f);

        vera::setCamera(cam);
    }

    if (help) {
        float w = (float)(vera::getWindowWidth());
        float h = (float)(vera::getWindowHeight());
        float xStep = w * 0.05;
        float yStep = h * 0.05;
        float x = xStep * 2.0f;
        float y = yStep * 3.0f;

        vera::Camera *cam = vera::getCamera();
        vera::resetCamera();

        vera::fill(0.0f, 0.0f, 0.0f, 0.75f);
        vera::noStroke();
        vera::rect(glm::vec2(w * 0.5f, h * 0.5f), glm::vec2(w - xStep * 2.0f, h - yStep * 2.0f));

        vera::fill(1.0f);
        vera::textAlign(vera::ALIGN_MIDDLE);
        vera::textAlign(vera::ALIGN_LEFT);
        vera::textAngle(0.0f);
        vera::textSize(22.0f);
        yStep = vera::getFontHeight() * 1.5f;

        if (geom_index != -1) {
            vera::text("a - " + std::string( m_sceneRender.showAxis? "hide" : "show" ) + " axis", x, y);
            y += yStep;
            vera::text("b - " + std::string( m_sceneRender.showBBoxes? "hide" : "show" ) + " bounding boxes", x, y);
            y += yStep;
        }

        vera::text("c - hide/show cursor", x, y);
        y += yStep;

        if (geom_index != -1) {
            vera::text("d - " + std::string( m_sceneRender.dynamicShadows? "disable" : "enable" ) + " dynamic shadows", x, y);
            y += yStep;
            vera::text("f - hide/show floor", x, y);
            y += yStep;
        }
        vera::text("F - " + std::string( vera::isFullscreen() ? "disable" : "enable" ) + " fullscreen", x, y);
        y += yStep;
        if (geom_index != -1) {
            vera::text("g - " + std::string( m_sceneRender.showGrid? "hide" : "show" ) + " grid", x, y);
            y += yStep;
        }

        vera::text("h - " + std::string( help? "hide" : "show" ) + " help", x, y);
        y += yStep;
        vera::text("i - hide/show extra info", x, y);
        y += yStep;
        vera::text("o - open shaders on default editor", x, y);
        y += yStep;
        vera::text("p - hide/show render passes/buffers", x, y);
        y += yStep;

        if (uniforms.streams.size() > 0) {
            vera::text("r - restart stream textures", x, y);
            y += yStep;
        }

        if (geom_index != -1) {
            vera::text("s - hide/show sky", x, y);
            y += yStep;
        }

        vera::text("t - hide/show loaded textures", x, y);
        y += yStep;
        vera::text("v - " + std::string( verbose? "disable" : "enable" ) + " verbose", x, y);
        y += yStep;

        if (uniforms.streams.size() > 0) {
            vera::text("space - start/stop stream textures", x, y);
            y += yStep;
        }
        
        vera::setCamera(cam);
        glDisable(GL_DEPTH_TEST);
    }

    TRACK_END("renderUI")
}